

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O1

void __thiscall QTableWidgetItem::setData(QTableWidgetItem *this,int role,QVariant *value)

{
  bool bVar1;
  bool bVar2;
  char cVar3;
  long lVar4;
  QTableModel *this_00;
  pointer pQVar5;
  QWidgetItemData *pQVar6;
  int iVar7;
  long lVar8;
  undefined8 uVar9;
  long in_FS_OFFSET;
  QArrayData *d;
  QArrayData *local_60;
  undefined1 local_58 [8];
  anon_union_24_3_e3d07ef4_for_data aStack_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  iVar7 = 0;
  if (role != 2) {
    iVar7 = role;
  }
  lVar4 = (this->values).d.size;
  if (lVar4 != 0) {
    pQVar6 = (this->values).d.ptr;
    lVar8 = -8;
    do {
      if (pQVar6->role == iVar7) {
        pQVar5 = QList<QWidgetItemData>::data(&this->values);
        cVar3 = ::QVariant::equals((QVariant *)((long)pQVar5 - lVar8));
        if (cVar3 != '\0') {
          bVar1 = false;
          goto LAB_005a00a7;
        }
        pQVar5 = QList<QWidgetItemData>::data(&this->values);
        ::QVariant::operator=((QVariant *)((long)pQVar5 - lVar8),value);
        bVar1 = true;
        bVar2 = true;
        goto LAB_005a00a9;
      }
      lVar8 = lVar8 + -0x28;
      pQVar6 = pQVar6 + 1;
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
  }
  bVar1 = true;
LAB_005a00a7:
  bVar2 = false;
LAB_005a00a9:
  if (bVar1) {
    if (!bVar2) {
      local_58._0_4_ = iVar7;
      ::QVariant::QVariant((QVariant *)&aStack_50,value);
      QtPrivate::QMovableArrayOps<QWidgetItemData>::emplace<QWidgetItemData>
                ((QMovableArrayOps<QWidgetItemData> *)&this->values,(this->values).d.size,
                 (QWidgetItemData *)local_58);
      QList<QWidgetItemData>::end(&this->values);
      ::QVariant::~QVariant((QVariant *)&aStack_50);
    }
    this_00 = tableModel(this);
    if (this_00 != (QTableModel *)0x0) {
      aStack_50._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
      aStack_50.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
      if (iVar7 == 0) {
        local_60 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
        uVar9 = 2;
        aStack_50.shared = (PrivateShared *)QArrayData::allocate(&local_60,4,0x10,2,KeepSize);
        *(undefined8 *)aStack_50.shared = 0x200000000;
      }
      else {
        local_60 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
        uVar9 = 1;
        aStack_50.shared = (PrivateShared *)QArrayData::allocate(&local_60,4,0x10,1,KeepSize);
        *(int *)aStack_50.shared = iVar7;
      }
      local_58 = (undefined1  [8])local_60;
      aStack_50._8_8_ = uVar9;
      QTableModel::itemChanged(this_00,this,(QList<int> *)local_58);
      if (local_58 != (undefined1  [8])0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_58)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_58)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_58)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_58,4,0x10);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTableWidgetItem::setData(int role, const QVariant &value)
{
    bool found = false;
    role = (role == Qt::EditRole ? Qt::DisplayRole : role);
    for (int i = 0; i < values.size(); ++i) {
        if (values.at(i).role == role) {
            if (values[i].value == value)
                return;

            values[i].value = value;
            found = true;
            break;
        }
    }
    if (!found)
        values.append(QWidgetItemData(role, value));
    if (QTableModel *model = tableModel())
    {
        const QList<int> roles((role == Qt::DisplayRole)
                                       ? QList<int>({ Qt::DisplayRole, Qt::EditRole })
                                       : QList<int>({ role }));
        model->itemChanged(this, roles);
    }
}